

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O3

int __thiscall
zmq::ip_resolver_t::resolve_getaddrinfo(ip_resolver_t *this,ip_addr_t *ip_addr_,char *addr_)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  addrinfo *res;
  long local_60;
  uint local_58;
  int local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  long local_28;
  
  local_60 = 0;
  local_30 = 0;
  local_40 = 0;
  uStack_38 = 0;
  uStack_48 = 0;
  bVar1 = (this->_options)._ipv6_wanted;
  local_54 = (uint)bVar1 * 8 + 2;
  local_50 = 1;
  bVar2 = (this->_options)._bindable_wanted;
  bVar3 = (this->_options)._dns_allowed;
  local_58 = (uint)bVar2;
  if ((byte)(bVar3 ^ 1U | bVar1) == 1) {
    uVar5 = bVar2 + 4;
    if (bVar3 != false) {
      uVar5 = (uint)bVar2;
    }
    local_58 = uVar5 + 8;
    if (bVar1 == false) {
      local_58 = uVar5;
    }
  }
  iVar4 = (*this->_vptr_ip_resolver_t[2])(this,addr_,0,&local_58,&local_60);
  if (iVar4 == -1) {
    if ((local_58 & 8) == 0) goto LAB_001e8650;
    local_58 = local_58 & 0xfffffff7;
    iVar4 = (*this->_vptr_ip_resolver_t[2])(this,addr_,0,&local_58,&local_60);
  }
  if (iVar4 == 0) {
    lVar7 = local_60;
    if (local_60 == 0) {
      resolve_getaddrinfo();
      lVar7 = local_28;
    }
    uVar5 = *(uint *)(lVar7 + 0x10);
    if (0x1c < uVar5) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_)",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
              ,0x18b);
      fflush(_stderr);
      zmq_abort("static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_)");
      uVar5 = *(uint *)(local_60 + 0x10);
      lVar7 = local_60;
    }
    memcpy(ip_addr_,*(void **)(lVar7 + 0x18),(ulong)uVar5);
    (*this->_vptr_ip_resolver_t[3])(this,lVar7);
    return 0;
  }
  if (iVar4 == -10) {
    piVar6 = __errno_location();
    *piVar6 = 0xc;
    return -1;
  }
LAB_001e8650:
  bVar1 = (this->_options)._bindable_wanted;
  piVar6 = __errno_location();
  if (bVar1 == true) {
    *piVar6 = 0x13;
  }
  else {
    *piVar6 = 0x16;
  }
  return -1;
}

Assistant:

int zmq::ip_resolver_t::resolve_getaddrinfo (ip_addr_t *ip_addr_,
                                             const char *addr_)
{
#if defined ZMQ_HAVE_OPENVMS && defined __ia64
    __addrinfo64 *res = NULL;
    __addrinfo64 req;
#else
    addrinfo *res = NULL;
    addrinfo req;
#endif

    memset (&req, 0, sizeof (req));

    //  Choose IPv4 or IPv6 protocol family. Note that IPv6 allows for
    //  IPv4-in-IPv6 addresses.
    req.ai_family = _options.ipv6 () ? AF_INET6 : AF_INET;

    //  Arbitrary, not used in the output, but avoids duplicate results.
    req.ai_socktype = SOCK_STREAM;

    req.ai_flags = 0;

    if (_options.bindable ()) {
        req.ai_flags |= AI_PASSIVE;
    }

    if (!_options.allow_dns ()) {
        req.ai_flags |= AI_NUMERICHOST;
    }

#if defined AI_V4MAPPED
    //  In this API we only require IPv4-mapped addresses when
    //  no native IPv6 interfaces are available (~AI_ALL).
    //  This saves an additional DNS roundtrip for IPv4 addresses.
    if (req.ai_family == AF_INET6) {
        req.ai_flags |= AI_V4MAPPED;
    }
#endif

    //  Resolve the literal address. Some of the error info is lost in case
    //  of error, however, there's no way to report EAI errors via errno.
    int rc = do_getaddrinfo (addr_, NULL, &req, &res);

#if defined AI_V4MAPPED
    // Some OS do have AI_V4MAPPED defined but it is not supported in getaddrinfo()
    // returning EAI_BADFLAGS. Detect this and retry
    if (rc == EAI_BADFLAGS && (req.ai_flags & AI_V4MAPPED)) {
        req.ai_flags &= ~AI_V4MAPPED;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

#if defined ZMQ_HAVE_WINDOWS
    //  Resolve specific case on Windows platform when using IPv4 address
    //  with ZMQ_IPv6 socket option.
    if ((req.ai_family == AF_INET6) && (rc == WSAHOST_NOT_FOUND)) {
        req.ai_family = AF_INET;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

    if (rc) {
        switch (rc) {
            case EAI_MEMORY:
                errno = ENOMEM;
                break;
            default:
                if (_options.bindable ()) {
                    errno = ENODEV;
                } else {
                    errno = EINVAL;
                }
                break;
        }
        return -1;
    }

    //  Use the first result.
    zmq_assert (res != NULL);
    zmq_assert (static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_));
    memcpy (ip_addr_, res->ai_addr, res->ai_addrlen);

    //  Cleanup getaddrinfo after copying the possibly referenced result.
    do_freeaddrinfo (res);

    return 0;
}